

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

char * cimg_library::cimg::ftype(FILE *file,char *filename)

{
  byte bVar1;
  char cVar2;
  uint value;
  int iVar3;
  CImgArgumentException *this;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  CImg<char> header;
  CImgList<char> _header;
  CImg<char> r;
  
  value = exception_mode::mode;
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this,"cimg::ftype(): Specified filename is (null).");
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  header._data = (char *)0x0;
  header._width = 0;
  header._height = 0;
  header._depth = 0;
  header._spectrum = 0;
  header._is_shared = false;
  exception_mode(0,true);
  CImg<char>::_load_raw(&header,file,filename,0x200,1,1,1,false,false,0);
  pcVar5 = header._data;
  iVar3 = strncmp(header._data,"OFF\n",4);
  if (iVar3 == 0) {
    pcVar6 = "off";
    goto LAB_00175f18;
  }
  iVar3 = strncmp(pcVar5,"#INRIMAGE",9);
  if (iVar3 == 0) {
    pcVar6 = "inr";
    goto LAB_00175f18;
  }
  iVar3 = strncmp(pcVar5,"PANDORE",7);
  if (iVar3 == 0) {
    pcVar6 = "pan";
    goto LAB_00175f18;
  }
  iVar3 = strncmp(pcVar5 + 0x80,"DICM",4);
  if (iVar3 == 0) {
    pcVar6 = "dcm";
    goto LAB_00175f18;
  }
  bVar1 = *pcVar5;
  if (bVar1 < 0x4d) {
    if (bVar1 == 0x42) {
      if (pcVar5[1] == 'M') {
        pcVar6 = "bmp";
        goto LAB_00175f18;
      }
    }
    else if (bVar1 == 0x47) {
      if ((((pcVar5[1] == 'I') && (pcVar5[2] == 'F')) && (pcVar5[3] == '8')) && (pcVar5[5] == 'a'))
      {
        pcVar6 = "gif";
        if ((pcVar5[4] == '7') || (pcVar5[4] == '9')) goto LAB_00175f18;
      }
    }
    else if ((bVar1 == 0x49) && (pcVar5[1] == 'I')) goto LAB_00175dc1;
  }
  else if (bVar1 == 0x4d) {
    if (pcVar5[1] == 'M') {
LAB_00175dc1:
      pcVar6 = "tif";
      goto LAB_00175f18;
    }
  }
  else if (bVar1 == 0x89) {
    if (((((pcVar5[1] == 'P') && (pcVar5[2] == 'N')) && (pcVar5[3] == 'G')) &&
        ((pcVar5[4] == '\r' && (pcVar5[5] == '\n')))) &&
       ((pcVar5[6] == '\x1a' && (pcVar5[7] == '\n')))) {
      pcVar6 = "png";
      goto LAB_00175f18;
    }
  }
  else if (((bVar1 == 0xff) && (pcVar5[1] == -0x28)) && (pcVar5[2] == -1)) {
    pcVar6 = "jpg";
    goto LAB_00175f18;
  }
  CImg<char>::CImg(&r,1,1,1,1);
  *r._data = '\n';
  CImg<char>::get_split<char>((CImg<char> *)&_header,&header,(char)&r,false);
  if ((r._is_shared == false) && (r._data != (char *)0x0)) {
    operator_delete__(r._data);
  }
  if ((long)(int)_header._width < 1) {
LAB_00175f0b:
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)0x0;
    lVar4 = 0;
    do {
      pcVar5 = *(char **)((long)&(_header._data)->_data + lVar4);
      cVar2 = *pcVar5;
      if (cVar2 != '#') {
        if ((cVar2 != 'P') || (*(int *)((long)&(_header._data)->_height + lVar4) != 2))
        goto LAB_00175f0b;
        bVar1 = pcVar5[1];
        pcVar5 = (char *)0x0;
        bVar7 = 0xf6 < (byte)(bVar1 - 0x3a);
        if (bVar7) {
          pcVar5 = "pnm";
        }
        bVar8 = (bVar1 & 0xdf) != 0x46;
        pcVar6 = "pfm";
        if (bVar8) {
          pcVar6 = pcVar5;
        }
        if (bVar8 && !bVar7) goto LAB_00175f0b;
        break;
      }
      lVar4 = lVar4 + 0x20;
    } while ((long)(int)_header._width * 0x20 != lVar4);
  }
  CImgList<char>::~CImgList(&_header);
LAB_00175f18:
  exception_mode(value,true);
  if ((header._is_shared == false) && (header._data != (char *)0x0)) {
    operator_delete__(header._data);
  }
  return pcVar6;
}

Assistant:

inline const char *ftype(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException("cimg::ftype(): Specified filename is (null).");
      static const char
        *const _pnm = "pnm",
        *const _pfm = "pfm",
        *const _bmp = "bmp",
        *const _gif = "gif",
        *const _jpg = "jpg",
        *const _off = "off",
        *const _pan = "pan",
        *const _png = "png",
        *const _tif = "tif",
        *const _inr = "inr",
        *const _dcm = "dcm";
      const char *f_type = 0;
      CImg<char> header;
      const unsigned int omode = cimg::exception_mode();
      cimg::exception_mode(0);
      try {
        header._load_raw(file,filename,512,1,1,1,false,false,0);
        const unsigned char *const uheader = (unsigned char*)header._data;
        if (!std::strncmp(header,"OFF\n",4)) f_type = _off; // OFF
        else if (!std::strncmp(header,"#INRIMAGE",9)) // INRIMAGE
          f_type = _inr;
        else if (!std::strncmp(header,"PANDORE",7)) // PANDORE
          f_type = _pan;
        else if (!std::strncmp(header.data() + 128,"DICM",4)) // DICOM
          f_type = _dcm;
        else if (uheader[0]==0xFF && uheader[1]==0xD8 && uheader[2]==0xFF) // JPEG
          f_type = _jpg;
        else if (header[0]=='B' && header[1]=='M') // BMP
          f_type = _bmp;
        else if (header[0]=='G' && header[1]=='I' && header[2]=='F' && header[3]=='8' && header[5]=='a' &&
                 (header[4]=='7' || header[4]=='9')) // GIF
          f_type = _gif;
        else if (uheader[0]==0x89 && uheader[1]==0x50 && uheader[2]==0x4E && uheader[3]==0x47 &&
                 uheader[4]==0x0D && uheader[5]==0x0A && uheader[6]==0x1A && uheader[7]==0x0A) // PNG
          f_type = _png;
        else if ((uheader[0]==0x49 && uheader[1]==0x49) || (uheader[0]==0x4D && uheader[1]==0x4D)) // TIFF
          f_type = _tif;
        else { // PNM or PFM
          CImgList<char> _header = header.get_split(CImg<char>::vector('\n'),0,false);
          cimglist_for(_header,l) {
            if (_header(l,0)=='#') continue;
            if (_header[l]._height==2 && _header(l,0)=='P') {
              const char c = _header(l,1);
              if (c=='f' || c=='F') { f_type = _pfm; break; }
              if (c>='1' && c<='9') { f_type = _pnm; break; }
            }
            f_type = 0; break;
          }
        }
      } catch (CImgIOException&) { }
      cimg::exception_mode(omode);
      return f_type;
    }